

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O2

ITexture * __thiscall
irr::video::CNullDriver::addTexture
          (CNullDriver *this,dimension2d<unsigned_int> *size,path *name,ECOLOR_FORMAT format)

{
  int iVar1;
  CImage *this_00;
  undefined4 extraout_var;
  double in_XMM0_Qa;
  ITexture *texture;
  
  if ((int)(name->str)._M_string_length == 0) {
    os::Printer::log((Printer *)"Could not create ITexture, texture needs to have a non-empty name."
                     ,in_XMM0_Qa);
  }
  else {
    this_00 = (CImage *)operator_new(0x50);
    CImage::CImage(this_00,format,size);
    iVar1 = (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x75])(this,name,this_00);
    texture = (ITexture *)CONCAT44(extraout_var,iVar1);
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&(this_00->super_IImage)._vptr_IImage +
               (long)(this_00->super_IImage)._vptr_IImage[-3]));
    if (texture != (ITexture *)0x0) {
      addTexture(this,texture);
      IReferenceCounted::drop
                ((IReferenceCounted *)
                 ((long)&texture->_vptr_ITexture + (long)texture->_vptr_ITexture[-3]));
      return texture;
    }
  }
  return (ITexture *)0x0;
}

Assistant:

ITexture *CNullDriver::addTexture(const core::dimension2d<u32> &size, const io::path &name, ECOLOR_FORMAT format)
{
	if (0 == name.size()) {
		os::Printer::log("Could not create ITexture, texture needs to have a non-empty name.", ELL_WARNING);
		return 0;
	}

	IImage *image = new CImage(format, size);
	ITexture *t = 0;

	if (checkImage(image)) {
		t = createDeviceDependentTexture(name, image);
	}

	image->drop();

	if (t) {
		addTexture(t);
		t->drop();
	}

	return t;
}